

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

void __thiscall Lowerer::LowerRemR8(Lowerer *this,Instr *instr)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  JITTimeFunctionBody *this_00;
  Opnd *pOVar4;
  HelperCallOpnd *newSrc;
  Instr *instr_local;
  Lowerer *this_local;
  
  if (instr == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x6b2d,"(instr)","instr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  if (instr->m_opcode != Rem_A) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x6b2e,"(instr->m_opcode == Js::OpCode::Rem_A)",
                       "instr->m_opcode == Js::OpCode::Rem_A");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  this_00 = Func::GetJITFunctionBody(this->m_func);
  bVar2 = JITTimeFunctionBody::IsAsmJsMode(this_00);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x6b2f,"(m_func->GetJITFunctionBody()->IsAsmJsMode())",
                       "m_func->GetJITFunctionBody()->IsAsmJsMode()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  pOVar4 = IR::Instr::UnlinkSrc2(instr);
  LowererMD::LoadDoubleHelperArgument(&this->m_lowererMD,instr,pOVar4);
  pOVar4 = IR::Instr::UnlinkSrc1(instr);
  LowererMD::LoadDoubleHelperArgument(&this->m_lowererMD,instr,pOVar4);
  newSrc = IR::HelperCallOpnd::New(HelperOp_Rem_Double,this->m_func);
  IR::Instr::SetSrc1(instr,&newSrc->super_Opnd);
  LowererMD::LowerCall(&this->m_lowererMD,instr,0);
  return;
}

Assistant:

void
Lowerer::LowerRemR8(IR::Instr * instr)
{
    Assert(instr);
    Assert(instr->m_opcode == Js::OpCode::Rem_A);
    Assert(m_func->GetJITFunctionBody()->IsAsmJsMode());

    m_lowererMD.LoadDoubleHelperArgument(instr, instr->UnlinkSrc2());
    m_lowererMD.LoadDoubleHelperArgument(instr, instr->UnlinkSrc1());
    instr->SetSrc1(IR::HelperCallOpnd::New(IR::JnHelperMethod::HelperOp_Rem_Double, m_func));
    m_lowererMD.LowerCall(instr, 0);
}